

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O0

void __thiscall
srell::
regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_srell::u8regex_traits<char>_>
::regex_iterator(regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_srell::u8regex_traits<char>_>
                 *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       a,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         b,regex_type *re,match_flag_type m)

{
  allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d;
  match_flag_type local_2c;
  regex_type *prStack_28;
  match_flag_type m_local;
  regex_type *re_local;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_srell::u8regex_traits<char>_>
  *this_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  b_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  a_local;
  
  (this->begin)._M_current = a._M_current;
  (this->end)._M_current = b._M_current;
  this->pregex = re;
  this->flags = m;
  local_2c = m;
  prStack_28 = re;
  re_local = (regex_type *)this;
  this_local = (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_srell::u8regex_traits<char>_>
                *)b._M_current;
  b_local = a;
  std::
  allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::allocator(&local_2d);
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results(&this->match,&local_2d);
  std::
  allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~allocator(&local_2d);
  regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,srell::u8regex_traits<char>>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(this->begin)._M_current,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(this->end)._M_current,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(this->begin)._M_current,&this->match,this->pregex,this->flags);
  return;
}

Assistant:

regex_iterator(
		const BidirectionalIterator a,
		const BidirectionalIterator b,
		const regex_type &re,
		const regex_constants::match_flag_type m = regex_constants::match_default)
		: begin(a), end(b), pregex(&re), flags(m)
	{
		regex_search(begin, end, begin, match, *pregex, flags);
			//  28.12.1.1: If this call returns false the constructor
			//    sets *this to the end-of-sequence iterator.
	}